

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.cpp
# Opt level: O3

void __thiscall
CoreML::TreeEnsembleRegressor::TreeEnsembleRegressor
          (TreeEnsembleRegressor *this,string *predictedValueOutput,string *description)

{
  string *psVar1;
  TypeUnion this_00;
  ModelDescription *this_01;
  Model *this_02;
  Model MStack_38;
  
  Model::Model(&MStack_38,description);
  TreeEnsembleBase::TreeEnsembleBase(&this->super_TreeEnsembleBase,&MStack_38,false);
  Model::~Model(&MStack_38);
  (this->super_TreeEnsembleBase).super_Model._vptr_Model =
       (_func_int **)&PTR__TreeEnsembleRegressor_003c4500;
  this_02 = (this->super_TreeEnsembleBase).super_Model.m_spec.
            super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_02->_oneof_case_[0] == 0x12e) {
    this_00 = this_02->Type_;
  }
  else {
    Specification::Model::clear_Type(this_02);
    this_02->_oneof_case_[0] = 0x12e;
    this_00.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x20);
    Specification::TreeEnsembleRegressor::TreeEnsembleRegressor(this_00.treeensembleregressor_);
    (this_02->Type_).treeensembleregressor_ = (TreeEnsembleRegressor *)this_00;
    this_02 = (this->super_TreeEnsembleBase).super_Model.m_spec.
              super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  this->tree_regressor_parameters = (TreeEnsembleRegressor *)this_00;
  this_01 = this_02->description_;
  if (this_01 == (ModelDescription *)0x0) {
    this_01 = (ModelDescription *)operator_new(0x78);
    Specification::ModelDescription::ModelDescription(this_01);
    this_02->description_ = this_01;
  }
  psVar1 = (this_01->predictedfeaturename_).ptr_;
  if (psVar1 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&this_01->predictedfeaturename_,predictedValueOutput);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar1);
  }
  return;
}

Assistant:

TreeEnsembleRegressor::TreeEnsembleRegressor
    (const std::string& predictedValueOutput,
     const std::string& description)
    : TreeEnsembleBase(Model(description), false /* isClassifier */)
    , tree_regressor_parameters(m_spec->mutable_treeensembleregressor())
    {
        m_spec->mutable_description()->set_predictedfeaturename(predictedValueOutput);
    }